

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O1

GCstr * lj_ctype_repr(lua_State *L,CTypeID id,GCstr *name)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  GCstr *pGVar7;
  long lVar8;
  size_t lenx;
  char *pcVar9;
  uint qual;
  long lVar10;
  CType *ct;
  CTRepr ctr;
  CTRepr local_268;
  char local_40 [15];
  byte local_31;
  
  local_268.pb = local_268.buf + 0x100;
  local_268.cts = *(CTState **)((L->glref).ptr64 + 0x180);
  local_268.needsp = 0;
  local_268.ok = 1;
  local_268.pe = local_268.pb;
  local_268.L = L;
  if (name != (GCstr *)0x0) {
    ctype_prepstr(&local_268,(char *)(name + 1),name->len);
  }
  ct = (local_268.cts)->tab + id;
  bVar4 = false;
  qual = 0;
  do {
    uVar1 = ct->info;
    pcVar9 = local_268.pb;
    if (8 < uVar1 >> 0x1c) goto switchD_00149ded_caseD_7;
    uVar5 = ct->size;
    switch(uVar1 >> 0x1c) {
    case 0:
      if ((uVar1 >> 0x1b & 1) != 0) {
        if (local_268.pb < local_268.buf + 5) goto LAB_0014a088;
        if (local_268.needsp != 0) {
          local_268.pb[-1] = ' ';
          local_268.pb = local_268.pb + -1;
        }
        pcVar9 = local_268.pb + -4;
        lVar8 = 0;
        do {
          local_268.pb[lVar8 + -1] = "bool"[lVar8 + 3];
          lVar8 = lVar8 + -1;
        } while (lVar8 != -4);
        goto LAB_0014a1df;
      }
      if ((uVar1 >> 0x1a & 1) != 0) {
        if (uVar5 == 4) {
          if (local_268.pb < local_268.buf + 6) goto LAB_0014a088;
          if (local_268.needsp != 0) {
            local_268.pb[-1] = ' ';
            local_268.pb = local_268.pb + -1;
          }
          pcVar9 = local_268.pb + -5;
          lVar8 = 0;
          do {
            local_268.pb[lVar8 + -1] = "float"[lVar8 + 4];
            lVar8 = lVar8 + -1;
          } while (lVar8 != -5);
        }
        else if (uVar5 == 8) {
          if (local_268.pb < local_268.buf + 7) goto LAB_0014a088;
          if (local_268.needsp != 0) {
            local_268.pb[-1] = ' ';
            local_268.pb = local_268.pb + -1;
          }
          pcVar9 = local_268.pb + -6;
          lVar8 = 0;
          do {
            local_268.pb[lVar8 + -1] = "long double"[lVar8 + 10];
            lVar8 = lVar8 + -1;
          } while (lVar8 != -6);
        }
        else {
          if (local_268.pb < local_268.buf + 0xc) goto LAB_0014a088;
          if (local_268.needsp != 0) {
            local_268.pb[-1] = ' ';
            local_268.pb = local_268.pb + -1;
          }
          pcVar9 = local_268.pb + -0xb;
          lVar8 = 0;
          do {
            local_268.pb[lVar8 + -1] = "long double"[lVar8 + 10];
            lVar8 = lVar8 + -1;
          } while (lVar8 != -0xb);
        }
        goto LAB_0014a1df;
      }
      if (uVar5 == 1) {
        if ((uVar1 >> 0x17 & 1) == 0) {
          if (local_268.pb < local_268.buf + 5) {
LAB_0014a088:
            local_268.ok = 0;
            goto LAB_0014a1e4;
          }
          if (local_268.needsp != 0) {
            local_268.pb[-1] = ' ';
            local_268.pb = local_268.pb + -1;
          }
          pcVar9 = local_268.pb + -4;
          lVar8 = 0;
          do {
            local_268.pb[lVar8 + -1] = "unsigned char"[lVar8 + 0xc];
            lVar8 = lVar8 + -1;
          } while (lVar8 != -4);
        }
        else {
          if (local_268.pb < local_268.buf + 0xe) goto LAB_0014a088;
          if (local_268.needsp != 0) {
            local_268.pb[-1] = ' ';
            local_268.pb = local_268.pb + -1;
          }
          pcVar9 = local_268.pb + -0xd;
          lVar8 = 0;
          do {
            local_268.pb[lVar8 + -1] = "unsigned char"[lVar8 + 0xc];
            lVar8 = lVar8 + -1;
          } while (lVar8 != -0xd);
        }
        goto LAB_0014a1df;
      }
      if (uVar5 < 8) {
        if (uVar5 == 4) {
          if (local_268.pb < local_268.buf + 4) goto LAB_0014a75a;
          if (local_268.needsp != 0) {
            local_268.pb[-1] = ' ';
            local_268.pb = local_268.pb + -1;
          }
          pcVar9 = local_268.pb + -3;
          lVar8 = 0;
          do {
            local_268.pb[lVar8 + -1] = "print"[lVar8 + 4];
            lVar8 = lVar8 + -1;
          } while (lVar8 != -3);
LAB_0014a8a4:
          local_268.needsp = 1;
          local_268.pb = pcVar9;
        }
        else {
          if (local_268.buf + 6 <= local_268.pb) {
            if (local_268.needsp != 0) {
              local_268.pb[-1] = ' ';
              local_268.pb = local_268.pb + -1;
            }
            pcVar9 = local_268.pb + -5;
            lVar8 = 0;
            do {
              local_268.pb[lVar8 + -1] = "short"[lVar8 + 4];
              lVar8 = lVar8 + -1;
            } while (lVar8 != -5);
            goto LAB_0014a8a4;
          }
LAB_0014a75a:
          local_268.ok = 0;
        }
        if ((uVar1 >> 0x17 & 1) != 0) {
          if (local_268.pb < local_268.buf + 9) goto LAB_0014a088;
          if (local_268.needsp != 0) {
            local_268.pb[-1] = ' ';
            local_268.pb = local_268.pb + -1;
          }
          pcVar9 = local_268.pb + -8;
          lVar8 = 0;
          do {
            local_268.pb[lVar8 + -1] = "unsigned"[lVar8 + 7];
            lVar8 = lVar8 + -1;
          } while (lVar8 != -8);
          goto LAB_0014a1df;
        }
      }
      else {
        if (local_268.pb < local_268.buf + 3) {
          local_268.ok = 0;
        }
        else {
          if (local_268.needsp != 0) {
            local_268.pb[-1] = ' ';
            local_268.pb = local_268.pb + -1;
          }
          local_268.needsp = 1;
          lVar8 = 2;
          do {
            local_268.pb[lVar8 + -3] = "unsigned"[lVar8 + 8];
            lVar8 = lVar8 + -1;
            pcVar9 = local_268.pb + -2;
          } while (lVar8 != 0);
        }
        local_268.pb = pcVar9;
        if (local_268.pb < local_268.buf + 0xb) {
          local_268.ok = 0;
        }
        else {
          uVar5 = uVar5 << 3;
          do {
            local_268.pb[-1] = (char)uVar5 + (char)(uVar5 / 10) * -10 | 0x30;
            local_268.pb = local_268.pb + -1;
            bVar3 = 9 < uVar5;
            uVar5 = uVar5 / 10;
          } while (bVar3);
          local_268.needsp = 0;
        }
        if (local_268.pb < local_268.buf + 4) {
          local_268.ok = 0;
          pcVar9 = local_268.pb;
        }
        else {
          if (local_268.needsp != 0) {
            local_268.pb[-1] = ' ';
            local_268.pb = local_268.pb + -1;
          }
          local_268.needsp = 1;
          lVar8 = 0;
          do {
            local_268.pb[lVar8 + -1] = "print"[lVar8 + 4];
            lVar8 = lVar8 + -1;
            pcVar9 = local_268.pb + -3;
          } while (lVar8 != -3);
        }
        local_268.pb = pcVar9;
        if ((uVar1 >> 0x17 & 1) != 0) {
          if (local_268.pb <= local_268.buf) goto LAB_0014a088;
          local_268.pb[-1] = 'u';
          local_268.pb = local_268.pb + -1;
        }
      }
      goto LAB_0014a1e4;
    case 1:
      pcVar9 = "union";
      if ((uVar1 >> 0x17 & 1) == 0) {
        pcVar9 = "struct";
      }
LAB_0014a022:
      ctype_preptype(&local_268,ct,qual,pcVar9);
      goto LAB_0014a049;
    case 2:
      if ((uVar1 >> 0x17 & 1) == 0) {
        ctype_prepqual(&local_268,qual | uVar1);
        pcVar9 = local_268.pb;
        if (uVar5 == 4) {
          if (local_268.pb < local_268.buf + 8) {
            local_268.ok = 0;
          }
          else {
            if (local_268.needsp != 0) {
              local_268.pb[-1] = ' ';
              local_268.pb = local_268.pb + -1;
            }
            lVar8 = 0;
            do {
              local_268.pb[lVar8 + -1] = "__ptr32"[lVar8 + 6];
              lVar8 = lVar8 + -1;
              pcVar9 = local_268.pb + -7;
            } while (lVar8 != -7);
          }
        }
        local_268.pb = pcVar9;
        if (local_268.buf < local_268.pb) {
          local_268.pb[-1] = '*';
          local_268.pb = local_268.pb + -1;
        }
        else {
          local_268.ok = 0;
        }
      }
      else if (local_268.buf < local_268.pb) {
        local_268.pb[-1] = '&';
        local_268.pb = local_268.pb + -1;
      }
      else {
        local_268.ok = 0;
      }
      local_268.needsp = 1;
      qual = 0;
      bVar4 = true;
      pcVar9 = local_268.pb;
      break;
    case 3:
      if ((uVar1 & 0xfc000000) == 0x30000000) {
        if (bVar4) {
          if (local_268.buf < local_268.pb) {
            local_268.pb[-1] = '(';
            local_268.pb = local_268.pb + -1;
          }
          else {
            local_268.ok = 0;
          }
          if (local_268.pe < local_40) {
            *local_268.pe = ')';
            local_268.pe = local_268.pe + 1;
          }
          else {
            local_268.ok = 0;
          }
        }
        if (local_268.pe < local_40) {
          *local_268.pe = '[';
          local_268.pe = local_268.pe + 1;
        }
        else {
          local_268.ok = 0;
        }
        pcVar9 = local_268.pe;
        local_268.needsp = 1;
        if (uVar5 == 0xffffffff) {
          if ((uVar1 >> 0x14 & 1) != 0) {
            if (local_40 <= local_268.pe) goto LAB_0014a4ed;
            *local_268.pe = '?';
            local_268.pe = local_268.pe + 1;
          }
        }
        else {
          uVar2 = (local_268.cts)->tab[(ushort)ct->info].size;
          if (uVar2 == 0) {
            uVar6 = 0;
          }
          else {
            uVar6 = (ulong)uVar5 / (ulong)uVar2;
          }
          if (local_268.buf + 0x1f6 < local_268.pe) {
LAB_0014a4ed:
            local_268.needsp = 1;
            local_268.ok = 0;
          }
          else {
            lVar8 = 0;
            do {
              lVar10 = lVar8;
              uVar5 = (uint)uVar6;
              (&local_31)[lVar10] = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
              lVar8 = lVar10 + -1;
              uVar6 = uVar6 / 10;
            } while (9 < uVar5);
            memcpy(local_268.pe,&local_31 + lVar10,-lVar8);
            local_268.pe = pcVar9 + -lVar8;
          }
        }
        if (local_40 <= local_268.pe) goto LAB_0014a588;
        *local_268.pe = ']';
        local_268.pe = local_268.pe + 1;
        goto LAB_0014a590;
      }
      if ((uVar1 >> 0x1a & 1) != 0) {
        if (uVar5 == 8) {
          if (local_268.pb < local_268.buf + 6) {
            local_268.ok = 0;
          }
          else {
            if (local_268.needsp != 0) {
              local_268.pb[-1] = ' ';
              local_268.pb = local_268.pb + -1;
            }
            local_268.needsp = 1;
            lVar8 = 0;
            do {
              local_268.pb[lVar8 + -1] = "float"[lVar8 + 4];
              lVar8 = lVar8 + -1;
              pcVar9 = local_268.pb + -5;
            } while (lVar8 != -5);
          }
        }
        local_268.pb = pcVar9;
        if (local_268.buf + 8 <= local_268.pb) {
          if (local_268.needsp != 0) {
            local_268.pb[-1] = ' ';
            local_268.pb = local_268.pb + -1;
          }
          pcVar9 = local_268.pb + -7;
          lVar8 = 0;
          do {
            local_268.pb[lVar8 + -1] = "complex"[lVar8 + 6];
            lVar8 = lVar8 + -1;
          } while (lVar8 != -7);
          goto LAB_0014a742;
        }
LAB_0014a706:
        local_268.ok = 0;
        goto LAB_0014a049;
      }
      if (local_268.pb < local_268.buf + 4) {
        local_268.ok = 0;
      }
      else {
        if (local_268.needsp != 0) {
          local_268.pb[-1] = ' ';
          local_268.pb = local_268.pb + -1;
        }
        local_268.needsp = 1;
        lVar8 = 0;
        do {
          local_268.pb[lVar8 + -1] = ")))"[lVar8 + 2];
          lVar8 = lVar8 + -1;
          pcVar9 = local_268.pb + -3;
        } while (lVar8 != -3);
      }
      local_268.pb = pcVar9;
      if (local_268.pb < local_268.buf + 0xb) {
        local_268.ok = 0;
      }
      else {
        do {
          local_268.pb[-1] = (char)uVar5 + (char)(uVar5 / 10) * -10 | 0x30;
          local_268.pb = local_268.pb + -1;
          bVar3 = 9 < uVar5;
          uVar5 = uVar5 / 10;
        } while (bVar3);
        local_268.needsp = 0;
      }
      if (local_268.pb < local_268.buf + 0x1c) {
        local_268.ok = 0;
        pcVar9 = local_268.pb;
      }
      else {
        if (local_268.needsp != 0) {
          local_268.pb[-1] = ' ';
          local_268.pb = local_268.pb + -1;
        }
        local_268.needsp = 1;
        lVar8 = 0;
        do {
          local_268.pb[lVar8 + -1] = "__attribute__((vector_size("[lVar8 + 0x1a];
          lVar8 = lVar8 + -1;
          pcVar9 = local_268.pb + -0x1b;
        } while (lVar8 != -0x1b);
      }
      break;
    case 4:
      if (local_268.pb < local_268.buf + 5) goto LAB_0014a088;
      if (local_268.needsp != 0) {
        local_268.pb[-1] = ' ';
        local_268.pb = local_268.pb + -1;
      }
      pcVar9 = local_268.pb + -4;
      lVar8 = 0;
      do {
        local_268.pb[lVar8 + -1] = "void"[lVar8 + 3];
        lVar8 = lVar8 + -1;
      } while (lVar8 != -4);
LAB_0014a1df:
      local_268.needsp = 1;
      local_268.pb = pcVar9;
LAB_0014a1e4:
      ctype_prepqual(&local_268,uVar1 | qual);
      bVar3 = false;
      goto LAB_0014a5ad;
    case 5:
      if (id != 0x16) {
        pcVar9 = "enum";
        goto LAB_0014a022;
      }
      if (local_268.pb < local_268.buf + 6) goto LAB_0014a706;
      if (local_268.needsp != 0) {
        local_268.pb[-1] = ' ';
        local_268.pb = local_268.pb + -1;
      }
      pcVar9 = local_268.pb + -5;
      lVar8 = 0;
      do {
        local_268.pb[lVar8 + -1] = "ctype"[lVar8 + 4];
        lVar8 = lVar8 + -1;
      } while (lVar8 != -5);
LAB_0014a742:
      local_268.needsp = 1;
      local_268.pb = pcVar9;
LAB_0014a049:
      bVar3 = false;
      goto LAB_0014a5ad;
    case 6:
      if (bVar4) {
        if (local_268.buf < local_268.pb) {
          local_268.pb[-1] = '(';
          local_268.pb = local_268.pb + -1;
        }
        else {
          local_268.ok = 0;
        }
        if (local_268.pe < local_40) {
          *local_268.pe = ')';
          local_268.pe = local_268.pe + 1;
        }
        else {
          local_268.ok = 0;
        }
      }
      if (local_268.pe < local_40) {
        *local_268.pe = '(';
        local_268.pe = local_268.pe + 1;
      }
      else {
        local_268.ok = 0;
      }
      local_268.needsp = 1;
      if (local_268.pe < local_40) {
        *local_268.pe = ')';
        local_268.pe = local_268.pe + 1;
      }
      else {
LAB_0014a588:
        local_268.ok = 0;
      }
LAB_0014a590:
      bVar4 = false;
      pcVar9 = local_268.pb;
      break;
    case 8:
      if ((uVar1 & 0xff0000) != 0x10000) {
        uVar5 = 0;
      }
      qual = qual | uVar5;
    }
switchD_00149ded_caseD_7:
    local_268.pb = pcVar9;
    ct = (CType *)((long)&(local_268.cts)->tab->info + (ulong)((uVar1 & 0xffff) * 0x18));
    bVar3 = true;
LAB_0014a5ad:
    if (!bVar3) {
      if (local_268.ok == 0) {
        pcVar9 = "?";
        lenx = 1;
      }
      else {
        lenx = (long)local_268.pe - (long)local_268.pb;
        pcVar9 = local_268.pb;
      }
      pGVar7 = lj_str_new(L,pcVar9,lenx);
      return pGVar7;
    }
  } while( true );
}

Assistant:

GCstr *lj_ctype_repr(lua_State *L, CTypeID id, GCstr *name)
{
  global_State *g = G(L);
  CTRepr ctr;
  ctr.pb = ctr.pe = &ctr.buf[CTREPR_MAX/2];
  ctr.cts = ctype_ctsG(g);
  ctr.L = L;
  ctr.ok = 1;
  ctr.needsp = 0;
  if (name) ctype_prepstr(&ctr, strdata(name), name->len);
  ctype_repr(&ctr, id);
  if (LJ_UNLIKELY(!ctr.ok)) return lj_str_newlit(L, "?");
  return lj_str_new(L, ctr.pb, ctr.pe - ctr.pb);
}